

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O3

void send_recv_start(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  undefined8 *extraout_RDX;
  int iVar6;
  undefined1 *puVar7;
  undefined1 auVar8 [16];
  undefined1 auStack_410 [8];
  undefined8 uStack_408;
  undefined1 auStack_400 [8];
  uv_process_t uStack_3f8;
  code *pcStack_370;
  uv_loop_t uStack_368;
  code *pcStack_18;
  
  iVar1 = uv_is_readable(0x2e5e30);
  if (iVar1 == 1) {
    iVar1 = uv_is_writable(0x2e5e30);
    if (iVar1 != 1) goto LAB_00161d9d;
    iVar1 = uv_is_closing(0x2e5e30);
    if (iVar1 != 0) goto LAB_00161da2;
    iVar1 = uv_read_start(0x2e5e30,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    send_recv_start_cold_1();
LAB_00161d9d:
    send_recv_start_cold_2();
LAB_00161da2:
    send_recv_start_cold_3();
  }
  send_recv_start_cold_4();
  pcStack_18 = (code *)0x161db2;
  puVar3 = (uv_loop_t *)uv_default_loop();
  pcStack_18 = (code *)0x161dbc;
  run_ipc_send_recv_helper(puVar3,0);
  pcStack_18 = (code *)0x161dc1;
  puVar3 = (uv_loop_t *)uv_default_loop();
  pcStack_18 = (code *)0x161dd5;
  uv_walk(puVar3,close_walk_cb,0);
  pcStack_18 = (code *)0x161ddf;
  uv_run(puVar3,0);
  pcStack_18 = (code *)0x161de4;
  uVar4 = uv_default_loop();
  pcStack_18 = (code *)0x161dec;
  iVar1 = uv_loop_close(uVar4);
  if (iVar1 == 0) {
    return;
  }
  pcStack_18 = ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_1();
  iVar1 = (int)&uStack_368;
  pcStack_370 = (code *)0x161e09;
  pcStack_18 = (code *)puVar3;
  iVar2 = uv_loop_init();
  if (iVar2 == 0) {
    pcStack_370 = (code *)0x161e1d;
    run_ipc_send_recv_helper(&uStack_368,1);
    pcStack_370 = (code *)0x161e25;
    iVar1 = (int)&uStack_368;
    iVar2 = uv_loop_close();
    puVar3 = &uStack_368;
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_370 = (code *)0x161e37;
    ipc_send_recv_helper_threadproc_cold_1();
  }
  pcStack_370 = run_test;
  ipc_send_recv_helper_threadproc_cold_2();
  puVar5 = auStack_400;
  puVar7 = auStack_400;
  pcStack_370 = (code *)puVar3;
  if (iVar1 == 0) {
    uStack_408 = (code *)0x161ecc;
    spawn_helper(&ctx.channel,&uStack_3f8,"ipc_send_recv_helper");
    uStack_408 = (code *)0x161eda;
    connect_cb(&ctx.connect_req,0);
LAB_00161eda:
    uStack_408 = (code *)0x161edf;
    puVar5 = (undefined1 *)uv_default_loop();
    iVar6 = 0;
    uStack_408 = (code *)0x161ee9;
    iVar2 = uv_run();
    if (iVar2 != 0) {
      uStack_408 = (code *)0x161f14;
      run_test_cold_3();
LAB_00161f14:
      uStack_408 = (code *)0x161f19;
      run_test_cold_4();
LAB_00161f19:
      uStack_408 = (code *)0x161f1e;
      run_test_cold_1();
      goto LAB_00161f1e;
    }
    if (recv_cb_count != 2) goto LAB_00161f14;
    if (iVar1 == 0) {
      return;
    }
    uStack_408 = (code *)0x161f02;
    iVar1 = uv_thread_join();
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    iVar6 = 0x161df9;
    uStack_408 = (code *)0x161e5e;
    iVar2 = uv_thread_create(auStack_400,ipc_send_recv_helper_threadproc,0x2a);
    if (iVar2 != 0) goto LAB_00161f19;
    uStack_408 = (code *)0x161e70;
    uv_sleep(1000);
    uStack_408 = (code *)0x161e75;
    puVar5 = (undefined1 *)uv_default_loop();
    iVar6 = 0x2e6330;
    uStack_408 = (code *)0x161e89;
    iVar2 = uv_pipe_init(puVar5,&ctx,1);
    if (iVar2 == 0) {
      uStack_408 = (code *)0x161eb2;
      uv_pipe_connect(0x2e6438,&ctx,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_00161eda;
    }
LAB_00161f1e:
    puVar7 = puVar5;
    uStack_408 = (code *)0x161f23;
    run_test_cold_2();
  }
  uStack_408 = connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)puVar7 == &ctx.connect_req) {
    if (iVar6 != 0) goto LAB_00161ff8;
    _auStack_410 = uv_buf_init(".",1);
    iVar1 = uv_write2(0x2e6498,&ctx,auStack_410,1,0x2e6620,0);
    if (iVar1 != 0) goto LAB_00161ffd;
    auVar8 = uv_buf_init(".",1);
    _auStack_410 = auVar8;
    iVar1 = uv_write2(0x2e6558,&ctx,auStack_410,1,0x2e6758,0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00162007;
    }
  }
  else {
    connect_cb_cold_1();
LAB_00161ff8:
    connect_cb_cold_2();
LAB_00161ffd:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_00162007:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return;
}

Assistant:

static void send_recv_start(void) {
  int r;
  ASSERT(1 == uv_is_readable((uv_stream_t*)&ctx2.channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*)&ctx2.channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*)&ctx2.channel));

  r = uv_read_start((uv_stream_t*)&ctx2.channel, alloc_cb, read_cb);
  ASSERT(r == 0);
}